

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O0

size_t u32CLZ(u32 w)

{
  uint uVar1;
  size_t sVar2;
  uint in_EDI;
  
  uVar1 = in_EDI | in_EDI >> 1;
  uVar1 = uVar1 | uVar1 >> 2;
  uVar1 = uVar1 | uVar1 >> 4;
  uVar1 = uVar1 | uVar1 >> 8;
  sVar2 = u32Weight((uVar1 | uVar1 >> 0x10) ^ 0xffffffff);
  return sVar2;
}

Assistant:

size_t SAFE(u32CLZ)(register u32 w)
{
	w = w | w >> 1;
	w = w | w >> 2;
	w = w | w >> 4;
	w = w | w >> 8;
	w = w | w >> 16;
	return u32Weight(~w);
}